

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O3

jieba_token_t * convert_tokens(vector<cppjieba::Word,_std::allocator<cppjieba::Word>_> *words)

{
  undefined8 *puVar1;
  pointer pWVar2;
  long lVar3;
  undefined8 uVar4;
  jieba_token_t *pjVar5;
  pointer pWVar6;
  long lVar7;
  long lVar8;
  pointer pWVar9;
  value_type word;
  undefined1 *local_60;
  undefined8 local_58;
  undefined1 local_50 [16];
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  
  pWVar6 = (words->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  pWVar2 = (words->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar8 = (long)pWVar6 - (long)pWVar2;
  pjVar5 = (jieba_token_t *)malloc((lVar8 >> 1) + 0x18);
  pWVar9 = pWVar6;
  if (pWVar6 != pWVar2) {
    lVar7 = (lVar8 >> 4) * -0x5555555555555555;
    lVar7 = lVar7 + (ulong)(lVar7 == 0);
    lVar8 = 0x10;
    do {
      pWVar6 = (words->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar3 = *(long *)((long)pWVar6 + lVar8 * 2 + -0x20);
      local_60 = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,lVar3,*(long *)((long)pWVar6 + lVar8 * 2 + -0x18) + lVar3);
      local_38 = *(undefined4 *)((long)&(pWVar6->word)._M_string_length + lVar8 * 2);
      uVar4 = *(undefined8 *)((long)&(pWVar6->word)._M_dataplus._M_p + lVar8 * 2);
      local_40 = (undefined4)uVar4;
      uStack_3c = (undefined4)((ulong)uVar4 >> 0x20);
      *(undefined4 *)((long)pjVar5 + lVar8 + -0x10) = local_40;
      *(undefined8 *)((long)pjVar5 + lVar8 + -8) = local_58;
      *(ulong *)((long)&pjVar5->offset + lVar8) = CONCAT44(local_38,uStack_3c);
      if (local_60 != local_50) {
        operator_delete(local_60);
      }
      lVar8 = lVar8 + 0x18;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    pWVar9 = (words->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pWVar6 = (words->super__Vector_base<cppjieba::Word,_std::allocator<cppjieba::Word>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  }
  lVar8 = (long)pWVar6 - (long)pWVar9 >> 1;
  *(undefined4 *)((long)&pjVar5->offset + lVar8) = 0;
  puVar1 = (undefined8 *)((long)&pjVar5->length + lVar8);
  *puVar1 = 0;
  puVar1[1] = 0;
  return pjVar5;
}

Assistant:

static jieba_token_t* convert_tokens(const std::vector<cppjieba::Word>& words) {
    size_t len = words.size();
    jieba_token_t* res = static_cast<jieba_token_t*>(malloc(sizeof(jieba_token_t) * (len + 1)));
    for (size_t i = 0; i < len; i++) {
      auto word = words[i];
      res[i].offset = word.offset;
      res[i].length = word.word.size();
      res[i].unicode_offset = word.unicode_offset;
      res[i].unicode_length = word.unicode_length;
    }
    res[words.size()].offset = 0;
    res[words.size()].length = 0;
    res[words.size()].unicode_offset = 0;
    res[words.size()].unicode_length = 0;
    return res;
}